

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

void google::protobuf::anon_unknown_26::ToUint128(Duration *value,uint128 *result,bool *negative)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = value->seconds_;
  if (((long)uVar3 < 0) || (uVar4 = value->nanos_, (int)uVar4 < 0)) {
    *negative = true;
    uVar1 = uVar3 * -1000000000;
    result->lo_ = -uVar3;
    uVar3 = -uVar3 >> 0x20;
    lVar2 = (uVar3 * 1000000000 >> 0x20) + (ulong)(uVar1 < uVar3 * 0x3b9aca0000000000);
    result->hi_ = 0;
    uVar4 = -value->nanos_;
  }
  else {
    *negative = false;
    result->lo_ = uVar3;
    result->hi_ = 0;
    uVar1 = uVar3 * 1000000000;
    lVar2 = ((uVar3 >> 0x20) * 1000000000 >> 0x20) +
            (ulong)(uVar1 < (uVar3 >> 0x20) * 0x3b9aca0000000000);
  }
  result->lo_ = uVar4 + uVar1;
  result->hi_ = lVar2 + (ulong)CARRY8((ulong)uVar4,uVar1);
  return;
}

Assistant:

void ToUint128(const Duration& value, uint128* result, bool* negative) {
  if (value.seconds() < 0 || value.nanos() < 0) {
    *negative = true;
    *result = static_cast<uint64>(-value.seconds());
    *result = *result * kNanosPerSecond + static_cast<uint32>(-value.nanos());
  } else {
    *negative = false;
    *result = static_cast<uint64>(value.seconds());
    *result = *result * kNanosPerSecond + static_cast<uint32>(value.nanos());
  }
}